

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_heap.cpp
# Opt level: O2

void __thiscall mjs::gc_heap::garbage_collect(gc_heap *this)

{
  allocation_context *this_00;
  gc_heap_ptr_untyped **ppgVar1;
  slot *psVar2;
  uint32_t *puVar3;
  pointer ppuVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  bool bVar7;
  uint32_t uVar8;
  slot *psVar9;
  long lVar10;
  uint uVar11;
  char *__assertion;
  pointer ppuVar12;
  pointer_set *__range1;
  allocation_context __tmp;
  allocation_context new_ac;
  
  bVar7 = gc_state::initial_state(&this->gc_state_);
  if (bVar7) {
    ppgVar1 = (this->pointers_).set_;
    uVar11 = (this->pointers_).size_;
    this_00 = &this->alloc_context_;
    for (lVar10 = 0; (ulong)uVar11 << 3 != lVar10; lVar10 = lVar10 + 8) {
      psVar9 = *(slot **)((long)ppgVar1 + lVar10);
      psVar2 = (this->alloc_context_).storage_;
      if ((psVar9 < psVar2) || (psVar2 + (this->alloc_context_).capacity_ <= psVar9)) {
        register_fixup(this,&psVar9[1].new_position);
      }
    }
    if ((this->gc_state_).pending_fixups.
        super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (this->gc_state_).pending_fixups.
        super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      allocation_context::run_destructors(this_00);
    }
    else {
      allocation_context::other_half(&new_ac,this_00);
      (this->gc_state_).new_context = &new_ac;
      (this->gc_state_).level = 0;
      while (ppuVar12 = (this->gc_state_).pending_fixups.
                        super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>._M_impl.
                        super__Vector_impl_data._M_finish,
            (this->gc_state_).pending_fixups.
            super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>._M_impl.
            super__Vector_impl_data._M_start != ppuVar12) {
        puVar3 = ppuVar12[-1];
        (this->gc_state_).pending_fixups.
        super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>._M_impl.
        super__Vector_impl_data._M_finish = ppuVar12 + -1;
        uVar8 = gc_move(this,*puVar3);
        *puVar3 = uVar8;
      }
      ppuVar4 = (this->gc_state_).weak_fixups.
                super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      for (ppuVar12 = (this->gc_state_).weak_fixups.
                      super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>._M_impl.
                      super__Vector_impl_data._M_start; ppuVar12 != ppuVar4; ppuVar12 = ppuVar12 + 1
          ) {
        uVar11 = **ppuVar12 - 1;
        if ((uVar11 < (this->alloc_context_).start_) ||
           ((this->alloc_context_).next_free_ <= uVar11)) {
          __assertion = "alloc_context_.pos_inside(*p - 1)";
          uVar11 = 0x40;
          goto LAB_00120da0;
        }
        psVar9 = allocation_context::get_at(this_00,uVar11);
        if ((psVar9->allocation).type == 0xfffffffe) {
          psVar9 = allocation_context::get_at(this_00,**ppuVar12);
          **ppuVar12 = psVar9->new_position;
        }
        else {
          **ppuVar12 = 0;
        }
      }
      ppuVar12 = (this->gc_state_).weak_fixups.
                 super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      if ((this->gc_state_).weak_fixups.
          super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>._M_impl.
          super__Vector_impl_data._M_finish != ppuVar12) {
        (this->gc_state_).weak_fixups.
        super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>._M_impl.
        super__Vector_impl_data._M_finish = ppuVar12;
      }
      uVar5 = *(undefined8 *)&(this->alloc_context_).next_free_;
      psVar9 = this_00->storage_;
      uVar6._0_4_ = (this->alloc_context_).capacity_;
      uVar6._4_4_ = (this->alloc_context_).start_;
      (this->alloc_context_).next_free_ = new_ac.next_free_;
      this_00->storage_ = new_ac.storage_;
      (this->alloc_context_).capacity_ = new_ac.capacity_;
      (this->alloc_context_).start_ = new_ac.start_;
      __tmp.next_free_ = (uint32_t)uVar5;
      new_ac.next_free_ = __tmp.next_free_;
      new_ac.storage_ = psVar9;
      new_ac._8_8_ = uVar6;
      allocation_context::run_destructors(&new_ac);
      (this->gc_state_).new_context = (allocation_context *)0x0;
    }
    bVar7 = gc_state::initial_state(&this->gc_state_);
    if (bVar7) {
      return;
    }
    __assertion = "gc_state_.initial_state()";
    uVar11 = 0x51;
  }
  else {
    __assertion = "gc_state_.initial_state()";
    uVar11 = 0x27;
  }
LAB_00120da0:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/gc_heap.cpp",
                uVar11,"void mjs::gc_heap::garbage_collect()");
}

Assistant:

void gc_heap::garbage_collect() {
    assert(gc_state_.initial_state());

    // Determine roots and add their positions as pending fixups
    // TODO: Used to move the roots lower in the pointers_ array (since we know they won't be destroyed this time around). That still might be an optimization.
    for (auto p: pointers_) {
        if (!alloc_context_.is_internal(p)) {
            register_fixup(p->pos_);
        }
    }

    if (!gc_state_.pending_fixups.empty()) {
        allocation_context new_ac = alloc_context_.other_half();

        gc_state_.new_context = &new_ac;
        gc_state_.level = 0;

        // Keep going while there are still fixups to be processed (note: the array changes between loop iterations)
        while (!gc_state_.pending_fixups.empty()) {
            auto ppos = gc_state_.pending_fixups.back();
            gc_state_.pending_fixups.pop_back();
            *ppos = gc_move(*ppos);
        }

        // Handle weak pointers - if they moved update, otherwise invalidate
        for (auto& p: gc_state_.weak_fixups) {
            assert(alloc_context_.pos_inside(*p - 1));
            auto a = alloc_context_.get_at(*p - 1)->allocation;
            if (a.type == gc_moved_type_index) {
                *p = alloc_context_.get_at(*p)->new_position;
            } else {
                *p = 0;
            }
        }
        gc_state_.weak_fixups.clear();

        std::swap(alloc_context_, new_ac);
        new_ac.run_destructors();
        gc_state_.new_context = nullptr;
    } else {
        alloc_context_.run_destructors();
    }

    assert(gc_state_.initial_state());
}